

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void cmFortranParser_RuleSubmodule(cmFortranParser *parser,char *module_name,char *submodule_name)

{
  long lVar1;
  string *__s;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  string local_120;
  _Base_ptr local_100;
  undefined1 local_f8;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  string *local_88;
  string *sub_name;
  allocator<char> local_69;
  string local_68;
  string local_48;
  string *local_28;
  string *mod_name;
  char *submodule_name_local;
  char *module_name_local;
  cmFortranParser *parser_local;
  
  if (parser->InPPFalseBranch == 0) {
    mod_name = (string *)submodule_name;
    submodule_name_local = module_name;
    module_name_local = (char *)parser;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,module_name,&local_69);
    cmsys::SystemTools::LowerCase(&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    __s = mod_name;
    local_28 = &local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,(char *)__s,&local_c9);
    cmsys::SystemTools::LowerCase(&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    local_88 = &local_a8;
    lVar1 = *(long *)(module_name_local + 0x1a0);
    cmFortranParser_s::ModName(&local_f0,(cmFortranParser_s *)module_name_local,local_28);
    pVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(lVar1 + 0x50),&local_f0);
    local_100 = (_Base_ptr)pVar2.first._M_node;
    local_f8 = pVar2.second;
    std::__cxx11::string::~string((string *)&local_f0);
    lVar1 = *(long *)(module_name_local + 0x1a0);
    cmFortranParser_s::SModName(&local_120,(cmFortranParser_s *)module_name_local,local_28,local_88)
    ;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(lVar1 + 0x20),&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void cmFortranParser_RuleSubmodule(cmFortranParser* parser,
                                   const char* module_name,
                                   const char* submodule_name)
{
  if (parser->InPPFalseBranch) {
    return;
  }

  // syntax:   "submodule (module_name) submodule_name"
  // requires: "module_name.mod"
  // provides: "module_name@submodule_name.smod"
  //
  // FIXME: Some compilers split the submodule part of a module into a
  // separate "module_name.smod" file.  Whether it is generated or
  // not depends on conditions more subtle than we currently detect.
  // For now we depend directly on "module_name.mod".

  std::string const& mod_name = cmSystemTools::LowerCase(module_name);
  std::string const& sub_name = cmSystemTools::LowerCase(submodule_name);
  parser->Info.Requires.insert(parser->ModName(mod_name));
  parser->Info.Provides.insert(parser->SModName(mod_name, sub_name));
}